

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel_sse
               (Mat *kernel,Mat *kernel_tm2,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int *piVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  long lVar23;
  _func_int ***ppp_Var24;
  uint uVar25;
  ulong uVar26;
  Allocator *pAVar27;
  ulong uVar28;
  void *pvVar29;
  ulong uVar30;
  _func_int ***ppp_Var31;
  Allocator *pAVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  undefined8 *puVar36;
  long lVar37;
  ulong uVar38;
  Allocator *pAVar39;
  _func_int ***ppp_Var40;
  int j;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float tmp [4] [3];
  Mat local_b8;
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  
  uVar38 = (ulong)(uint)outch;
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elempack = 0;
  local_b8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.elemsize._4_4_ = (int)local_b8.refcount;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.c = local_b8.elempack;
  Mat::create(&local_b8,0x10,inch,outch,4,(Allocator *)0x0);
  auVar20 = _DAT_0054fe80;
  auVar19 = _DAT_0054e600;
  uVar26 = (ulong)(uint)inch;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar30 = 0;
    pAVar39 = (Allocator *)local_b8.data;
    do {
      if (0 < inch) {
        iVar21 = inch * 9 * (int)uVar30;
        uVar34 = 0;
        pAVar27 = pAVar39;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar34 * 0x24 + (long)iVar21 * 4 + 0x20);
          fVar14 = auVar19._0_4_;
          fVar15 = auVar19._4_4_;
          fVar16 = auVar19._8_4_;
          fVar17 = auVar19._12_4_;
          auVar42._0_4_ = fVar2 * 0.0 + fVar1 * fVar14 + fVar3 * 0.0;
          auVar42._4_4_ = fVar2 * 0.5 + fVar1 * fVar15 + fVar3 * 0.5;
          auVar42._8_4_ = fVar2 * -0.5 + fVar1 * fVar16 + fVar3 * 0.5;
          auVar42._12_4_ = fVar2 * 0.0 + fVar1 * fVar17 + fVar3 * 1.0;
          auVar43._0_4_ = fVar5 * 0.0 + fVar4 * fVar14 + fVar6 * 0.0;
          auVar43._4_4_ = fVar5 * 0.5 + fVar4 * fVar15 + fVar6 * 0.5;
          auVar43._8_4_ = fVar5 * -0.5 + fVar4 * fVar16 + fVar6 * 0.5;
          auVar43._12_4_ = fVar5 * 0.0 + fVar4 * fVar17 + fVar6 * 1.0;
          auVar44._0_8_ =
               CONCAT44(fVar8 * 0.5 + fVar7 * fVar15 + fVar9 * 0.5,
                        fVar8 * 0.0 + fVar7 * fVar14 + fVar9 * 0.0);
          auVar44._8_4_ = fVar8 * -0.5 + fVar7 * fVar16 + fVar9 * 0.5;
          auVar44._12_4_ = fVar8 * 0.0 + fVar7 * fVar17 + fVar9 * 1.0;
          auVar46._16_16_ = auVar43;
          auVar46._0_16_ = auVar42;
          auVar48 = vpermilps_avx(auVar46,auVar20);
          auVar47._16_16_ = auVar42;
          auVar47._0_16_ = auVar43;
          auVar46 = vmovsldup_avx(auVar47);
          auVar46 = vblendps_avx(auVar48,auVar46,0x42);
          auVar48._8_8_ = auVar44._0_8_;
          auVar48._0_8_ = auVar44._0_8_;
          auVar48._16_16_ = auVar44;
          local_68 = vblendps_avx(auVar46,auVar48,0x24);
          auVar43 = vshufps_avx(auVar42,auVar43,0xff);
          auVar42 = vshufpd_avx(auVar44,auVar44,3);
          local_48 = vblendps_avx(auVar42,auVar43,6);
          lVar41 = 0;
          pAVar32 = pAVar27;
          do {
            fVar1 = *(float *)(local_68 + lVar41 * 0xc);
            uVar10 = *(undefined8 *)(local_68 + lVar41 * 0xc + 4);
            puVar36 = &DAT_005500b4;
            lVar23 = 0;
            do {
              auVar45._0_4_ = (float)*puVar36 * (float)uVar10;
              auVar45._4_4_ = (float)((ulong)*puVar36 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar45._8_8_ = 0;
              auVar42 = vmovshdup_avx(auVar45);
              *(float *)((long)&pAVar32->_vptr_Allocator + lVar23 * 4) =
                   auVar45._0_4_ + fVar1 * *(float *)((long)puVar36 + -4) + auVar42._0_4_;
              lVar23 = lVar23 + 1;
              puVar36 = (undefined8 *)((long)puVar36 + 0xc);
            } while (lVar23 != 4);
            lVar41 = lVar41 + 1;
            pAVar32 = pAVar32 + 2;
          } while (lVar41 != 4);
          uVar34 = uVar34 + 1;
          pAVar27 = (Allocator *)
                    ((long)&pAVar27->_vptr_Allocator +
                    (long)local_b8.w *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        } while (uVar34 != uVar26);
      }
      uVar30 = uVar30 + 1;
      pAVar39 = (Allocator *)
                ((long)&pAVar39->_vptr_Allocator +
                local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
    } while (uVar30 != uVar38);
  }
  uVar25 = outch + 3;
  uVar33 = outch + 7;
  if (-1 < outch) {
    uVar25 = outch;
    uVar33 = outch;
  }
  iVar22 = outch - (uVar33 & 0xfffffff8);
  iVar21 = (outch - (uVar33 & 0xfffffff8)) + 3;
  if (-1 < iVar22) {
    iVar21 = iVar22;
  }
  uVar30 = 0;
  Mat::create(kernel_tm2,inch * 8,0x10,
              (outch - (uVar25 & 0xfffffffc)) + ((int)uVar33 >> 3) + (iVar21 >> 2),4,
              (Allocator *)0x0);
  if (7 < outch) {
    iVar21 = kernel_tm2->w;
    pvVar11 = kernel_tm2->data;
    sVar12 = kernel_tm2->elemsize;
    sVar13 = kernel_tm2->cstep;
    uVar34 = 0;
    do {
      lVar41 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      ppp_Var24 = (_func_int ***)((long)(_func_int ***)local_b8.data + lVar41 * uVar34);
      lVar23 = 0;
      do {
        if (0 < inch) {
          lVar35 = (long)pvVar11 + (long)iVar21 * sVar12 * lVar23 + (uVar34 >> 3) * sVar13 * sVar12;
          uVar30 = 0;
          ppp_Var31 = ppp_Var24;
          do {
            lVar37 = 0;
            ppp_Var40 = ppp_Var31;
            do {
              *(undefined4 *)(lVar35 + lVar37) = *(undefined4 *)ppp_Var40;
              ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar41);
              lVar37 = lVar37 + 4;
            } while (lVar37 != 0x20);
            uVar30 = uVar30 + 1;
            ppp_Var31 = (_func_int ***)
                        ((long)ppp_Var31 +
                        (long)local_b8.w *
                        CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
            lVar35 = lVar35 + 0x20;
          } while (uVar30 != uVar26);
        }
        lVar23 = lVar23 + 1;
        ppp_Var24 = (_func_int ***)((long)ppp_Var24 + 4);
      } while (lVar23 != 0x10);
      uVar30 = uVar34 + 8;
      uVar28 = uVar34 + 0xf;
      uVar34 = uVar30;
    } while (uVar28 < uVar38);
  }
  if ((int)((uint)uVar30 | 3) < outch) {
    iVar21 = kernel_tm2->w;
    pvVar11 = kernel_tm2->data;
    sVar12 = kernel_tm2->elemsize;
    sVar13 = kernel_tm2->cstep;
    uVar30 = uVar30 & 0xffffffff;
    do {
      lVar41 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      ppp_Var24 = (_func_int ***)((long)(_func_int ***)local_b8.data + lVar41 * uVar30);
      lVar23 = 0;
      do {
        if (0 < inch) {
          lVar35 = (long)pvVar11 +
                   (long)iVar21 * sVar12 * lVar23 +
                   (ulong)(((uint)(uVar30 >> 3) & 0x1fffffff) + (uint)(((uint)uVar30 >> 2 & 1) != 0)
                          ) * sVar13 * sVar12;
          uVar34 = 0;
          ppp_Var31 = ppp_Var24;
          do {
            lVar37 = 0;
            ppp_Var40 = ppp_Var31;
            do {
              *(undefined4 *)(lVar35 + lVar37) = *(undefined4 *)ppp_Var40;
              ppp_Var40 = (_func_int ***)((long)ppp_Var40 + lVar41);
              lVar37 = lVar37 + 4;
            } while (lVar37 != 0x10);
            uVar34 = uVar34 + 1;
            ppp_Var31 = (_func_int ***)
                        ((long)ppp_Var31 +
                        (long)local_b8.w *
                        CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
            lVar35 = lVar35 + 0x10;
          } while (uVar34 != uVar26);
        }
        lVar23 = lVar23 + 1;
        ppp_Var24 = (_func_int ***)((long)ppp_Var24 + 4);
      } while (lVar23 != 0x10);
      uVar30 = uVar30 + 4;
    } while ((int)((uint)uVar30 | 3) < outch);
  }
  if ((int)uVar30 < outch) {
    iVar21 = kernel_tm2->w;
    pvVar11 = kernel_tm2->data;
    sVar12 = kernel_tm2->elemsize;
    uVar34 = uVar30 & 0xffffffff;
    sVar13 = kernel_tm2->cstep;
    do {
      uVar33 = (uint)uVar30;
      pvVar29 = (void *)((ulong)((uVar33 & 3) + ((uint)(uVar30 >> 3) & 0x1fffffff) +
                                (uint)((uVar33 >> 2 & 1) != 0)) * sVar13 * sVar12 + (long)pvVar11);
      ppp_Var24 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data +
                  CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) * local_b8.cstep *
                  uVar34);
      lVar41 = 0;
      do {
        if (0 < inch) {
          uVar30 = 0;
          ppp_Var31 = ppp_Var24;
          do {
            *(undefined4 *)((long)pvVar29 + uVar30 * 4) = *(undefined4 *)ppp_Var31;
            uVar30 = uVar30 + 1;
            ppp_Var31 = (_func_int ***)
                        ((long)ppp_Var31 +
                        (long)local_b8.w *
                        CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
          } while (uVar26 != uVar30);
        }
        lVar41 = lVar41 + 1;
        ppp_Var24 = (_func_int ***)((long)ppp_Var24 + 4);
        pvVar29 = (void *)((long)pvVar29 + (long)iVar21 * sVar12);
      } while (lVar41 != 0x10);
      uVar34 = uVar34 + 1;
      uVar30 = (ulong)(uVar33 + 1);
    } while (uVar34 != uVar38);
  }
  piVar18 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm2, int inch, int outch, const Option& opt)
{
    Mat kernel_tm(4 * 4, inch, outch);

    // G
    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 16-inch-outch
    // dst = inch-16-outch
#if __SSE2__
    kernel_tm2.create(8 * inch, 16, outch / 8 + (outch % 8) / 4 + outch % 4);
#else
    kernel_tm2.create(inch, 16, outch);
#endif

    int q = 0;
#if __SSE2__
    for (; q + 7 < outch; q += 8)
    {
        Mat g0 = kernel_tm2.channel(q / 8);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 8; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
#endif
    for (; q < outch; q++)
    {
#if __SSE2__
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4 + q % 4);
#else
        Mat g0 = kernel_tm2.channel(q);
#endif

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                const float* k00 = kernel_tm.channel(q).row(p);
                g00[0] = k00[k];
                g00++;
            }
        }
    }
}